

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O0

void __thiscall SerialTaskRunner::MaybeScheduleProcessQueue(SerialTaskRunner *this)

{
  long lVar1;
  bool bVar2;
  CScheduler *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  function<void_()> *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff9b;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  CScheduler *this_00;
  function<void_()> local_38;
  time_point in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_00,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
             ,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(bool)in_stack_ffffffffffffff9b);
  if ((in_RDI->field_0x50 & 1) == 0) {
    bVar2 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            empty((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                  in_stack_ffffffffffffff78);
    if (bVar2) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
    }
  }
  else {
    iVar3 = 1;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff78);
  if (iVar3 == 0) {
    std::function<void()>::function<SerialTaskRunner::MaybeScheduleProcessQueue()::__0,void>
              (&local_38,
               (anon_class_8_1_8991fb9c *)
               (in_RDI->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__align);
    std::chrono::_V2::steady_clock::now();
    CScheduler::schedule
              (this_00,(Function *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffe8);
    std::function<void_()>::~function(in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SerialTaskRunner::MaybeScheduleProcessQueue()
{
    {
        LOCK(m_callbacks_mutex);
        // Try to avoid scheduling too many copies here, but if we
        // accidentally have two ProcessQueue's scheduled at once its
        // not a big deal.
        if (m_are_callbacks_running) return;
        if (m_callbacks_pending.empty()) return;
    }
    m_scheduler.schedule([this] { this->ProcessQueue(); }, std::chrono::steady_clock::now());
}